

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

void ini_property_remove(ini_t *ini,int section,int property)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  ini_internal_property_t *piVar8;
  long lVar9;
  ini_internal_property_t *piVar10;
  int iVar11;
  byte bVar12;
  
  bVar12 = 0;
  if ((-1 < section && ini != (ini_t *)0x0) && (section < ini->section_count)) {
    iVar6 = -1;
    if (0 < (long)ini->property_count) {
      piVar8 = ini->properties;
      lVar9 = 0;
      iVar11 = 0;
      do {
        if (piVar8->section == section) {
          if (iVar11 == property) {
            iVar6 = (int)lVar9;
            break;
          }
          iVar11 = iVar11 + 1;
        }
        lVar9 = lVar9 + 1;
        piVar8 = piVar8 + 1;
      } while (ini->property_count != lVar9);
    }
    if (iVar6 != -1) {
      pcVar1 = ini->properties[iVar6].value_large;
      if (pcVar1 != (char *)0x0) {
        (**ini->memctx)(pcVar1,0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      }
      pcVar1 = ini->properties[iVar6].name_large;
      if (pcVar1 != (char *)0x0) {
        (**ini->memctx)(pcVar1,0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      }
      lVar9 = (long)ini->property_count + -1;
      ini->property_count = (int)lVar9;
      piVar8 = ini->properties + lVar9;
      piVar10 = ini->properties + iVar6;
      for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
        cVar2 = piVar8->name[0];
        cVar3 = piVar8->name[1];
        cVar4 = piVar8->name[2];
        cVar5 = piVar8->name[3];
        piVar10->section = piVar8->section;
        piVar10->name[0] = cVar2;
        piVar10->name[1] = cVar3;
        piVar10->name[2] = cVar4;
        piVar10->name[3] = cVar5;
        piVar8 = (ini_internal_property_t *)((long)piVar8 + (ulong)bVar12 * -0x10 + 8);
        piVar10 = (ini_internal_property_t *)((long)piVar10 + (ulong)bVar12 * -0x10 + 8);
      }
    }
  }
  return;
}

Assistant:

void ini_property_remove( ini_t* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            {
            if( ini->properties[ p ].value_large ) INI_FREE( ini->memctx, ini->properties[ p ].value_large );
            if( ini->properties[ p ].name_large ) INI_FREE( ini->memctx, ini->properties[ p ].name_large );
            ini->properties[ p ] = ini->properties[ --ini->property_count  ];
            return;
            }
        }
    }